

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *
getSlicingCriteriaInstructions
          (Module *M,string *slicingCriteria,bool criteria_are_next_instr,LLVMPointerAnalysis *pta,
          bool constructed_only)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  raw_ostream *this;
  reference ppVVar6;
  reference pSVar7;
  byte in_CL;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *in_RDI;
  byte in_R9B;
  undefined1 unaff_retaddr;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *in_stack_00000008;
  string *in_stack_00000010;
  LLVMPointerAnalysis *in_stack_00000018;
  Module *in_stack_00000020;
  SlicingCriteriaSet *SC_1;
  iterator __end2;
  iterator __begin2;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__range2;
  Value *val_2;
  iterator __end4_1;
  iterator __begin4_1;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *__range4_1;
  size_t n_1;
  Value *val_1;
  iterator __end4;
  iterator __begin4;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *__range4;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  newset;
  Value *val;
  iterator __end3;
  iterator __begin3;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *__range3;
  size_t n;
  bool ssctoall;
  value_type *SC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  primsec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *crit;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  secondaryToAll;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *result;
  Value *in_stack_fffffffffffffde8;
  raw_ostream *in_stack_fffffffffffffdf0;
  _Rb_tree_const_iterator<const_llvm::Value_*> in_stack_fffffffffffffdf8;
  _Rb_tree_const_iterator<const_llvm::Value_*> in_stack_fffffffffffffe00;
  raw_ostream *in_stack_fffffffffffffe20;
  raw_ostream *in_stack_fffffffffffffe28;
  bool local_1b9;
  __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
  local_188 [2];
  _Base_ptr local_178;
  _Base_ptr local_170;
  Value *local_168;
  _Self local_160;
  _Self local_158;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *local_150;
  ulong local_148;
  Value *local_140;
  _Self local_138;
  _Self local_130;
  reference local_128;
  Value *local_f0;
  _Self local_e8;
  _Self local_e0;
  reference local_d8;
  ulong local_d0;
  bool local_c1;
  reference local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  reference local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  undefined1 *local_88;
  byte local_49;
  undefined1 local_48 [31];
  byte local_29;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_29 = in_R9B & 1;
  splitList((string *)in_stack_fffffffffffffe28,(char)((ulong)in_stack_fffffffffffffe20 >> 0x38));
  local_49 = 0;
  std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::vector
            ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)0x1de216);
  std::
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>::
  set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
       *)0x1de223);
  local_88 = local_48;
  local_90._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffde8);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffde8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) {
      bVar1 = std::
              set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
              ::empty((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                       *)0x1de9a0);
      if (!bVar1) {
        local_188[0]._M_current =
             (SlicingCriteriaSet *)
             std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::begin
                       ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
                        in_stack_fffffffffffffde8);
        std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::end
                  ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
                   in_stack_fffffffffffffde8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
                                   *)in_stack_fffffffffffffdf0,
                                  (__normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
                                   *)in_stack_fffffffffffffde8), bVar1) {
          pSVar7 = __gnu_cxx::
                   __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
                   ::operator*(local_188);
          bVar1 = std::
                  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  ::empty((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                           *)0x1dea1f);
          if (!bVar1) {
            in_stack_fffffffffffffdf0 = (raw_ostream *)&pSVar7->secondary;
            std::
            set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
            ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                     *)in_stack_fffffffffffffde8);
            std::
            set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
            ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                   *)in_stack_fffffffffffffde8);
            std::
            set<llvm::Value_const*,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
            ::insert<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                      ((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                        *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffe00,
                       in_stack_fffffffffffffdf8);
          }
          __gnu_cxx::
          __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
          ::operator++(local_188);
        }
      }
      local_49 = 1;
      std::
      set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
      ::~set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
              *)0x1dea99);
      if ((local_49 & 1) == 0) {
        std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::~vector
                  ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
                   in_stack_fffffffffffffe00._M_node);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe00._M_node);
      return (vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)in_RDI;
    }
    local_a0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_90);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::emplace_back<>
                ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
                 in_stack_fffffffffffffdf0);
      splitList((string *)in_stack_fffffffffffffe28,(char)((ulong)in_stack_fffffffffffffe20 >> 0x38)
               );
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_b8);
      if (2 < sVar4) {
        llvm::errs();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                   (char *)in_stack_fffffffffffffdf8._M_node);
      }
      local_c0 = std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::back
                           ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
                            in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_b8,0);
      uVar2 = std::__cxx11::string::empty();
      local_1b9 = false;
      if ((uVar2 & 1) != 0) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_b8);
        local_1b9 = 1 < sVar4;
      }
      local_c1 = local_1b9;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_b8,0);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_b8,0);
        getCriteriaInstructions
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                   (bool)unaff_retaddr);
      }
      bVar1 = std::
              set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
              ::empty((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                       *)0x1de3ce);
      if (!bVar1) {
        llvm::errs();
        in_stack_fffffffffffffe28 =
             llvm::raw_ostream::operator<<
                       ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                        (char *)in_stack_fffffffffffffdf8._M_node);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_b8,0);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                   (string *)in_stack_fffffffffffffdf8._M_node);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                   (char *)in_stack_fffffffffffffdf8._M_node);
        local_d0 = 0;
        local_d8 = local_c0;
        local_e0._M_node =
             (_Base_ptr)
             std::
             set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
             ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      *)in_stack_fffffffffffffde8);
        local_e8._M_node =
             (_Base_ptr)
             std::
             set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
             ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    *)in_stack_fffffffffffffde8);
        while (bVar1 = std::operator!=(&local_e0,&local_e8), bVar1) {
          ppVVar6 = std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator*
                              ((_Rb_tree_const_iterator<const_llvm::Value_*> *)0x1de48a);
          local_f0 = *ppVVar6;
          local_d0 = local_d0 + 1;
          if (10 < local_d0) break;
          llvm::errs();
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                     (char *)in_stack_fffffffffffffdf8._M_node);
          llvm::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                     (char *)in_stack_fffffffffffffdf8._M_node);
          std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator++
                    ((_Rb_tree_const_iterator<const_llvm::Value_*> *)in_stack_fffffffffffffdf0);
        }
        sVar5 = std::
                set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                        *)0x1de503);
        if (local_d0 <= sVar5) {
          llvm::errs();
          in_stack_fffffffffffffe20 =
               llvm::raw_ostream::operator<<
                         ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                          (char *)in_stack_fffffffffffffdf8._M_node);
          sVar5 = std::
                  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                          *)0x1de533);
          llvm::raw_ostream::operator<<(in_stack_fffffffffffffe20,(sVar5 - local_d0) + 1);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                     (char *)in_stack_fffffffffffffdf8._M_node);
        }
        if ((local_19 & 1) != 0) {
          mapToNextInstr(in_RDI);
          std::
          set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
          ::swap((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)in_stack_fffffffffffffdf0,
                 (set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)in_stack_fffffffffffffde8);
          local_d0 = 0;
          local_128 = local_c0;
          local_130._M_node =
               (_Base_ptr)
               std::
               set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
               ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                        *)in_stack_fffffffffffffde8);
          local_138._M_node =
               (_Base_ptr)
               std::
               set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
               ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      *)in_stack_fffffffffffffde8);
          while (bVar1 = std::operator!=(&local_130,&local_138), bVar1) {
            ppVVar6 = std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator*
                                ((_Rb_tree_const_iterator<const_llvm::Value_*> *)0x1de601);
            local_140 = *ppVVar6;
            local_d0 = local_d0 + 1;
            if (10 < local_d0) break;
            llvm::errs();
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
            llvm::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
            std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator++
                      ((_Rb_tree_const_iterator<const_llvm::Value_*> *)in_stack_fffffffffffffdf0);
          }
          sVar5 = std::
                  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                          *)0x1de67a);
          if (local_d0 <= sVar5) {
            llvm::errs();
            this = llvm::raw_ostream::operator<<
                             ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                              (char *)in_stack_fffffffffffffdf8._M_node);
            sVar5 = std::
                    set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                            *)0x1de6aa);
            llvm::raw_ostream::operator<<(this,(sVar5 - local_d0) + 1);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
          }
          std::
          set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
          ::~set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)0x1de6df);
        }
      }
      bVar1 = std::
              set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
              ::empty((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                       *)0x1de6ee);
      if (((!bVar1) || ((local_c1 & 1U) != 0)) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_b8), 1 < sVar4)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_b8,1);
        getCriteriaInstructions
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                   (bool)unaff_retaddr);
        bVar1 = std::
                set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                ::empty((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                         *)0x1de781);
        if (!bVar1) {
          local_148 = 0;
          llvm::errs();
          in_stack_fffffffffffffe00._M_node =
               (_Base_ptr)
               llvm::raw_ostream::operator<<
                         (in_stack_fffffffffffffe00._M_node,in_stack_fffffffffffffdf8._M_node);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_b8,1);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                     (string *)in_stack_fffffffffffffdf8._M_node);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                     (char *)in_stack_fffffffffffffdf8._M_node);
          local_150 = &local_c0->secondary;
          local_158._M_node =
               (_Base_ptr)
               std::
               set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
               ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                        *)in_stack_fffffffffffffde8);
          local_160._M_node =
               (_Base_ptr)
               std::
               set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
               ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      *)in_stack_fffffffffffffde8);
          while (bVar1 = std::operator!=(&local_158,&local_160), bVar1) {
            ppVVar6 = std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator*
                                ((_Rb_tree_const_iterator<const_llvm::Value_*> *)0x1de842);
            local_168 = *ppVVar6;
            local_148 = local_148 + 1;
            if (10 < local_148) break;
            llvm::errs();
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
            llvm::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
            std::_Rb_tree_const_iterator<const_llvm::Value_*>::operator++
                      ((_Rb_tree_const_iterator<const_llvm::Value_*> *)in_stack_fffffffffffffdf0);
          }
          sVar5 = std::
                  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                          *)0x1de8bf);
          if (local_148 <= sVar5) {
            llvm::errs();
            in_stack_fffffffffffffdf8._M_node =
                 (_Base_ptr)
                 llvm::raw_ostream::operator<<
                           (in_stack_fffffffffffffe00._M_node,in_stack_fffffffffffffdf8._M_node);
            sVar5 = std::
                    set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    ::size((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                            *)0x1de8ef);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffdf8._M_node,(sVar5 - local_148) + 1);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_fffffffffffffe00._M_node,
                       (char *)in_stack_fffffffffffffdf8._M_node);
          }
        }
        if ((local_c1 & 1U) != 0) {
          local_170 = (_Base_ptr)
                      std::
                      set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                               *)in_stack_fffffffffffffde8);
          local_178 = (_Base_ptr)
                      std::
                      set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                             *)in_stack_fffffffffffffde8);
          std::
          set<llvm::Value_const*,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>::
          insert<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                    ((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                      *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdf8);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe00._M_node);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

static std::vector<SlicingCriteriaSet> getSlicingCriteriaInstructions(
        llvm::Module &M, const std::string &slicingCriteria,
        bool criteria_are_next_instr, LLVMPointerAnalysis *pta = nullptr,
        bool constructed_only = false) {
    std::vector<std::string> criteria = splitList(slicingCriteria, ';');
    assert(!criteria.empty() && "Did not get slicing criteria");

    std::vector<SlicingCriteriaSet> result;
    std::set<const llvm::Value *> secondaryToAll;

    // map the criteria to instructions
    for (const auto &crit : criteria) {
        if (crit.empty())
            continue;

        result.emplace_back();

        auto primsec = splitList(crit, '|');
        if (primsec.size() > 2) {
            llvm::errs() << "WARNING: Only one | in SC supported, ignoring the "
                            "rest\n";
        }
        assert(primsec.size() >= 1 && "Invalid criterium");
        auto &SC = result.back();
        // do we have some criterion of the form |X?
        // I.e., only secondary SC? It means that that should
        // be added to every primary SC
        bool ssctoall = primsec[0].empty() && primsec.size() > 1;
        if (!primsec[0].empty()) {
            getCriteriaInstructions(M, pta, primsec[0], SC.primary,
                                    constructed_only);
        }

        if (!SC.primary.empty()) {
            llvm::errs() << "SC: Matched '" << primsec[0] << "' to: \n";
            size_t n = 0;
            for (const auto *val : SC.primary) {
                if (++n > 10)
                    break;
                llvm::errs() << "  " << *val << "\n";
            }
            if (SC.primary.size() >= n) {
                llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                             << " more\n";
            }

            if (criteria_are_next_instr) {
                // the given (primary) criteria are just markers for the
                // next instruction, so map the criteria to
                // the next instructions
                auto newset = mapToNextInstr(SC.primary);
                SC.primary.swap(newset);

                n = 0;
                for (const auto *val : SC.primary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  SC (next): " << *val << "\n";
                }
                if (SC.primary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }
        }

        if ((!SC.primary.empty() || ssctoall) && primsec.size() > 1) {
            getCriteriaInstructions(M, pta, primsec[1], SC.secondary,
                                    constructed_only);

            if (!SC.secondary.empty()) {
                size_t n = 0;
                llvm::errs() << "SC: Matched '" << primsec[1]
                             << "' (secondary) to: \n";
                for (const auto *val : SC.secondary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  " << *val << "\n";
                }
                if (SC.secondary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }

            if (ssctoall) {
                secondaryToAll.insert(SC.secondary.begin(), SC.secondary.end());
            }
        }
    }

    if (!secondaryToAll.empty()) {
        for (auto &SC : result) {
            if (SC.primary.empty())
                continue;
            SC.secondary.insert(secondaryToAll.begin(), secondaryToAll.end());
        }
    }

    return result;
}